

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.cpp
# Opt level: O2

void __thiscall
duckdb::ValidityMask::SliceInPlace
          (ValidityMask *this,ValidityMask *other,idx_t target_offset,idx_t source_offset,
          idx_t count)

{
  unsigned_long *puVar1;
  unsigned_long *puVar2;
  byte bVar3;
  uint uVar4;
  sbyte sVar5;
  sbyte sVar6;
  uint uVar7;
  ulong *puVar8;
  unsigned_long uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  bool bVar15;
  
  if ((other->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0 &&
      (this->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    return;
  }
  TemplatedValidityMask<unsigned_long>::EnsureWritable
            (&this->super_TemplatedValidityMask<unsigned_long>);
  uVar13 = (uint)count & 0x3f;
  uVar14 = count >> 6;
  sVar5 = (sbyte)uVar13;
  if ((((uint)target_offset | (uint)source_offset) & 0x3f) == 0) {
    puVar1 = (this->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    puVar2 = (other->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    uVar10 = target_offset + 0x3f >> 6;
    if (puVar2 == (unsigned_long *)0x0) {
      switchD_016d4fed::default(puVar1 + uVar10,0xff,uVar14 * 8);
      if ((count & 0x3f) == 0) {
        return;
      }
      uVar9 = 0xffffffffffffffff;
    }
    else {
      puVar2 = puVar2 + (source_offset + 0x3f >> 6);
      switchD_016b0717::default(puVar1 + uVar10,puVar2,uVar14 * 8);
      if ((count & 0x3f) == 0) {
        return;
      }
      uVar9 = puVar2[uVar14];
    }
    uVar11 = (uVar9 << (-sVar5 & 0x3fU)) >> (-sVar5 & 0x3fU);
    puVar8 = puVar1 + uVar10 + uVar14;
  }
  else {
    if ((target_offset & 0x3f) != 0) {
      while (bVar15 = count != 0, count = count - 1, bVar15) {
        bVar15 = TemplatedValidityMask<unsigned_long>::RowIsValid
                           (&other->super_TemplatedValidityMask<unsigned_long>,source_offset);
        TemplatedValidityMask<unsigned_long>::Set
                  (&this->super_TemplatedValidityMask<unsigned_long>,target_offset,bVar15);
        target_offset = target_offset + 1;
        source_offset = source_offset + 1;
      }
      return;
    }
    uVar7 = (uint)source_offset & 0x3f;
    uVar4 = 0x40 - uVar7;
    puVar1 = (this->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    puVar2 = (other->super_TemplatedValidityMask<unsigned_long>).validity_mask +
             (source_offset >> 6);
    uVar9 = *puVar2;
    lVar12 = 0;
    while( true ) {
      sVar6 = (sbyte)uVar7;
      bVar3 = (byte)uVar4;
      if (uVar14 * 8 == lVar12) break;
      uVar10 = uVar9 >> sVar6;
      uVar9 = *(ulong *)((long)puVar2 + lVar12 + 8);
      *(unsigned_long *)((long)puVar1 + lVar12 + (target_offset >> 3)) =
           uVar9 << (bVar3 & 0x3f) | uVar10;
      lVar12 = lVar12 + 8;
    }
    if ((count & 0x3f) == 0) {
      return;
    }
    uVar14 = uVar9 >> sVar6;
    if (uVar4 < uVar13) {
      uVar14 = uVar14 | *(long *)((long)puVar2 + lVar12 + 8) << (bVar3 & 0x3f);
    }
    puVar8 = (ulong *)((long)puVar1 + lVar12 + (target_offset >> 3));
    uVar11 = (uVar14 << (-sVar5 & 0x3fU)) >> (-sVar5 & 0x3fU);
  }
  *puVar8 = (*puVar8 >> sVar5) << sVar5 | uVar11;
  return;
}

Assistant:

void ValidityMask::SliceInPlace(const ValidityMask &other, idx_t target_offset, idx_t source_offset, idx_t count) {
	if (AllValid() && other.AllValid()) {
		// Both validity masks are uninitialized, nothing to do
		return;
	}
	EnsureWritable();
	const idx_t ragged = count % BITS_PER_VALUE;
	const idx_t entire_units = count / BITS_PER_VALUE;
	if (IsAligned(source_offset) && IsAligned(target_offset)) {
		auto target_validity = GetData();
		auto source_validity = other.GetData();
		auto source_offset_entries = EntryCount(source_offset);
		auto target_offset_entries = EntryCount(target_offset);
		if (!source_validity) {
			// if source has no validity mask - set all bytes to 1
			memset(target_validity + target_offset_entries, 0xFF, sizeof(validity_t) * entire_units);
		} else {
			memcpy(target_validity + target_offset_entries, source_validity + source_offset_entries,
			       sizeof(validity_t) * entire_units);
		}
		if (ragged) {
			auto src_entry =
			    source_validity ? source_validity[source_offset_entries + entire_units] : ValidityBuffer::MAX_ENTRY;
			src_entry &= (ValidityBuffer::MAX_ENTRY >> (BITS_PER_VALUE - ragged));

			target_validity += target_offset_entries + entire_units;
			auto tgt_entry = *target_validity;
			tgt_entry &= (ValidityBuffer::MAX_ENTRY << ragged);

			*target_validity = tgt_entry | src_entry;
		}
		return;
	} else if (IsAligned(target_offset)) {
		//	Simple common case where we are shifting into an aligned mask (e.g., 0 in Slice above)
		const idx_t tail = source_offset % BITS_PER_VALUE;
		const idx_t head = BITS_PER_VALUE - tail;
		auto source_validity = other.GetData() + (source_offset / BITS_PER_VALUE);
		auto target_validity = this->GetData() + (target_offset / BITS_PER_VALUE);
		auto src_entry = *source_validity++;
		for (idx_t i = 0; i < entire_units; ++i) {
			//	Start with head of previous src
			validity_t tgt_entry = src_entry >> tail;
			src_entry = *source_validity++;
			// 	Add in tail of current src
			tgt_entry |= (src_entry << head);
			*target_validity++ = tgt_entry;
		}
		//	Finish last ragged entry
		if (ragged) {
			//	Start with head of previous src
			validity_t tgt_entry = (src_entry >> tail);
			//  Add in the tail of the next src, if head was too small
			if (head < ragged) {
				src_entry = *source_validity++;
				tgt_entry |= (src_entry << head);
			}
			//  Mask off the bits that go past the ragged end
			tgt_entry &= (ValidityBuffer::MAX_ENTRY >> (BITS_PER_VALUE - ragged));
			//	Restore the ragged end of the target
			tgt_entry |= *target_validity & (ValidityBuffer::MAX_ENTRY << ragged);
			*target_validity++ = tgt_entry;
		}
		return;
	}

	// FIXME: use bitwise operations here
#if 1
	for (idx_t i = 0; i < count; i++) {
		Set(target_offset + i, other.RowIsValid(source_offset + i));
	}
#else
	// first shift the "whole" units
	idx_t entire_units = offset / BITS_PER_VALUE;
	idx_t sub_units = offset - entire_units * BITS_PER_VALUE;
	if (entire_units > 0) {
		idx_t validity_idx;
		for (validity_idx = 0; validity_idx + entire_units < STANDARD_ENTRY_COUNT; validity_idx++) {
			new_mask.validity_mask[validity_idx] = other.validity_mask[validity_idx + entire_units];
		}
	}
	// now we shift the remaining sub units
	// this gets a bit more complicated because we have to shift over the borders of the entries
	// e.g. suppose we have 2 entries of length 4 and we left-shift by two
	// 0101|1010
	// a regular left-shift of both gets us:
	// 0100|1000
	// we then OR the overflow (right-shifted by BITS_PER_VALUE - offset) together to get the correct result
	// 0100|1000 ->
	// 0110|1000
	if (sub_units > 0) {
		idx_t validity_idx;
		for (validity_idx = 0; validity_idx + 1 < STANDARD_ENTRY_COUNT; validity_idx++) {
			new_mask.validity_mask[validity_idx] =
			    (other.validity_mask[validity_idx] >> sub_units) |
			    (other.validity_mask[validity_idx + 1] << (BITS_PER_VALUE - sub_units));
		}
		new_mask.validity_mask[validity_idx] >>= sub_units;
	}
#ifdef DEBUG
	for (idx_t i = offset; i < STANDARD_VECTOR_SIZE; i++) {
		D_ASSERT(new_mask.RowIsValid(i - offset) == other.RowIsValid(i));
	}
	Initialize(new_mask);
#endif
#endif
}